

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O2

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  uint *puVar1;
  byte bVar2;
  char cVar3;
  int *piVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  curlfiletype cVar8;
  int iVar9;
  CURLcode err;
  curl_fileinfo *pcVar10;
  char *pcVar11;
  int *piVar12;
  void *pvVar13;
  long lVar14;
  ushort **ppuVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sStack_50;
  char *p;
  
  uVar16 = size * nmemb;
  piVar4 = (int *)**(undefined8 **)(*connptr + 0x8a80);
  if (piVar4[3] == 0) {
    if ((uVar16 != 0) && (*piVar4 == 0)) {
      *piVar4 = ((byte)(*buffer - 0x30U) < 10) + 1;
    }
    for (uVar18 = 0; uVar18 < uVar16; uVar18 = uVar18 + 1) {
      bVar2 = buffer[uVar18];
      pcVar10 = *(curl_fileinfo **)(piVar4 + 4);
      if (pcVar10 == (curl_fileinfo *)0x0) {
        pcVar10 = Curl_fileinfo_alloc();
        *(curl_fileinfo **)(piVar4 + 4) = pcVar10;
        if (pcVar10 == (curl_fileinfo *)0x0) {
          piVar4[3] = 0x1b;
          return uVar16;
        }
        pcVar11 = (char *)(*Curl_cmalloc)(0xa0);
        pcVar10 = *(curl_fileinfo **)(piVar4 + 4);
        pcVar10->b_data = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_00125338;
        pcVar10->b_size = 0xa0;
        piVar4[8] = 0;
        piVar4[9] = 0;
        piVar4[6] = 0;
      }
      else {
        pcVar11 = pcVar10->b_data;
      }
      sVar5 = pcVar10->b_used;
      pcVar10->b_used = sVar5 + 1;
      pcVar11[sVar5] = bVar2;
      if (pcVar10->b_size - 1 <= pcVar10->b_used) {
        pcVar11 = (char *)(*Curl_crealloc)(pcVar10->b_data,pcVar10->b_size + 0xa0);
        if (pcVar11 == (char *)0x0) {
          Curl_fileinfo_dtor((void *)0x0,*(void **)(piVar4 + 4));
          piVar4[4] = 0;
          piVar4[5] = 0;
          piVar4[3] = 0x1b;
LAB_00125338:
          PL_ERROR((connectdata *)connptr,CURLE_OUT_OF_MEMORY);
          return uVar16;
        }
        pcVar10->b_size = pcVar10->b_size + 0xa0;
        pcVar10->b_data = pcVar11;
      }
      uVar19 = (ulong)bVar2;
      if (*piVar4 == 2) {
        switch(piVar4[1]) {
        case 0:
          uVar7 = piVar4[6] + 1;
          piVar4[6] = uVar7;
          if (uVar7 < 9) {
            pcVar11 = "0123456789-";
            sStack_50 = 0xc;
LAB_00124d33:
            pvVar13 = memchr(pcVar11,(int)(char)bVar2,sStack_50);
            if (pvVar13 == (void *)0x0) goto LAB_00125363;
          }
          else {
            if ((uVar7 != 9) || (bVar2 != 0x20)) goto LAB_00125363;
            piVar4[1] = 1;
            piVar4[2] = 0;
          }
          break;
        case 1:
          iVar9 = piVar4[6];
          piVar4[6] = iVar9 + 1U;
          if (piVar4[2] == 1) {
            if (bVar2 == 0x20) {
              *(long *)(piVar4 + 0x10) = *(long *)(piVar4 + 8);
              pcVar10->b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
              piVar4[1] = 2;
              piVar4[2] = 0;
              goto LAB_00124cb0;
            }
            pcVar11 = "APM0123456789:";
            sStack_50 = 0xf;
            goto LAB_00124d33;
          }
          if ((piVar4[2] != 0) ||
             (ppuVar15 = __ctype_b_loc(), (*(byte *)((long)*ppuVar15 + uVar19 * 2 + 1) & 0x20) != 0)
             ) break;
LAB_00125048:
          piVar4[2] = 1;
          break;
        case 2:
          iVar9 = piVar4[2];
          if (iVar9 != 1) goto LAB_00124c5e;
          iVar9 = piVar4[6];
          piVar4[6] = iVar9 + 1U;
          if (bVar2 == 0x20) {
            pcVar10->b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
            pcVar11 = pcVar10->b_data;
            lVar14 = *(long *)(piVar4 + 8);
            iVar9 = strcmp("<DIR>",pcVar11 + lVar14);
            if (iVar9 == 0) {
              pcVar10->filetype = CURLFILETYPE_DIRECTORY;
              pcVar10->size = 0;
              lVar14 = *(long *)(piVar4 + 4);
            }
            else {
              lVar14 = strtol(pcVar11 + lVar14,&p,10);
              pcVar10->size = lVar14;
              if ((*p != '\0') ||
                 ((lVar14 + 0x8000000000000001U < 2 &&
                  (piVar12 = __errno_location(), *piVar12 == 0x22)))) goto LAB_00125363;
              lVar14 = *(long *)(piVar4 + 4);
              *(undefined4 *)(lVar14 + 8) = 0;
            }
            *(byte *)(lVar14 + 0x60) = *(byte *)(lVar14 + 0x60) | 0x40;
LAB_001252c8:
            piVar4[6] = 0;
            piVar4[1] = 3;
            piVar4[2] = 0;
          }
          break;
        case 3:
          iVar9 = piVar4[2];
          if (iVar9 == 2) {
            if (bVar2 != 10) goto LAB_00125363;
          }
          else {
            if (iVar9 != 1) goto LAB_00124c5e;
            piVar4[6] = piVar4[6] + 1;
            if (bVar2 != 10) {
              if (bVar2 == 0xd) {
                piVar4[2] = 2;
                pcVar10->b_data[pcVar10->b_used - 1] = '\0';
              }
              break;
            }
            pcVar10->b_data[pcVar10->b_used - 1] = '\0';
          }
          *(undefined8 *)(piVar4 + 10) = *(undefined8 *)(piVar4 + 8);
          err = ftp_pl_insert_finfo((connectdata *)connptr,pcVar10);
          if (err != CURLE_OK) goto LAB_0012536a;
          piVar4[1] = 0;
          piVar4[2] = 0;
        }
        goto switchD_00124852_default;
      }
      if (*piVar4 != 1) {
        return uVar16 + 1;
      }
      switch(piVar4[1]) {
      case 0:
        if (piVar4[2] == 1) {
          uVar7 = piVar4[6];
          piVar4[6] = uVar7 + 1;
          if (bVar2 == 10) {
            pcVar10->b_data[uVar7] = '\0';
            pcVar11 = pcVar10->b_data;
            iVar9 = strncmp("total ",pcVar11,6);
            if (iVar9 == 0) {
              pbVar17 = (byte *)(pcVar11 + 6);
              ppuVar15 = __ctype_b_loc();
              do {
                bVar2 = *pbVar17;
                pbVar17 = pbVar17 + 1;
              } while ((*(byte *)((long)*ppuVar15 + (ulong)bVar2 * 2 + 1) & 0x20) != 0);
              if (bVar2 == 0) {
                piVar4[1] = 1;
                pcVar10->b_used = 0;
                break;
              }
            }
            goto LAB_00125363;
          }
          if (bVar2 == 0xd) {
            piVar4[6] = uVar7;
            pcVar10->b_used = pcVar10->b_used - 1;
          }
        }
        else if (piVar4[2] == 0) {
          if (bVar2 == 0x74) {
            piVar4[2] = 1;
            piVar4[6] = piVar4[6] + 1;
          }
          else {
            piVar4[1] = 1;
            pcVar10->b_used = 0;
            uVar18 = uVar18 - 1;
          }
        }
        break;
      case 1:
        if (bVar2 == 0x2d) {
          cVar8 = CURLFILETYPE_FILE;
        }
        else if (bVar2 == 0x44) {
          cVar8 = CURLFILETYPE_DOOR;
        }
        else if (bVar2 == 0x62) {
          cVar8 = CURLFILETYPE_DEVICE_BLOCK;
        }
        else if (bVar2 == 99) {
          cVar8 = CURLFILETYPE_DEVICE_CHAR;
        }
        else if (bVar2 == 0x73) {
          cVar8 = CURLFILETYPE_SOCKET;
        }
        else if (bVar2 == 0x6c) {
          cVar8 = CURLFILETYPE_SYMLINK;
        }
        else if (bVar2 == 0x70) {
          cVar8 = CURLFILETYPE_NAMEDPIPE;
        }
        else {
          if (bVar2 != 100) goto LAB_00125363;
          cVar8 = CURLFILETYPE_DIRECTORY;
        }
        pcVar10->filetype = cVar8;
        piVar4[1] = 2;
        piVar4[6] = 0;
        piVar4[8] = 1;
        piVar4[9] = 0;
        break;
      case 2:
        uVar7 = piVar4[6] + 1;
        piVar4[6] = uVar7;
        if (uVar7 < 10) {
          pcVar11 = "rwx-tTsS";
          sStack_50 = 9;
          goto LAB_00124d33;
        }
        if (uVar7 == 10) {
          if (bVar2 == 0x20) {
            pcVar10->b_data[10] = '\0';
            pcVar11 = pcVar10->b_data;
            lVar14 = *(long *)(piVar4 + 8);
            uVar7 = (uint)(pcVar11[lVar14] != '-') << 0x18;
            if (pcVar11[lVar14] == 'r') {
              uVar7 = 0x100;
            }
            if (pcVar11[lVar14 + 1] != '-') {
              if (pcVar11[lVar14 + 1] == 'w') {
                uVar7 = uVar7 | 0x80;
              }
              else {
                uVar7 = uVar7 | 0x1000000;
              }
            }
            cVar3 = pcVar11[lVar14 + 2];
            if (cVar3 != '-') {
              if (cVar3 == 'S') {
                uVar7 = uVar7 | 0x800;
              }
              else if (cVar3 == 's') {
                uVar7 = uVar7 | 0x840;
              }
              else if (cVar3 == 'x') {
                uVar7 = uVar7 | 0x40;
              }
              else {
                uVar7 = uVar7 | 0x1000000;
              }
            }
            if (pcVar11[lVar14 + 3] != '-') {
              if (pcVar11[lVar14 + 3] == 'r') {
                uVar7 = uVar7 | 0x20;
              }
              else {
                uVar7 = uVar7 | 0x1000000;
              }
            }
            if (pcVar11[lVar14 + 4] != '-') {
              if (pcVar11[lVar14 + 4] == 'w') {
                uVar7 = uVar7 | 0x10;
              }
              else {
                uVar7 = uVar7 | 0x1000000;
              }
            }
            cVar3 = pcVar11[lVar14 + 5];
            if (cVar3 != '-') {
              if (cVar3 == 'S') {
                uVar7 = uVar7 | 0x400;
              }
              else if (cVar3 == 's') {
                uVar7 = uVar7 | 0x408;
              }
              else if (cVar3 == 'x') {
                uVar7 = uVar7 | 8;
              }
              else {
                uVar7 = uVar7 | 0x1000000;
              }
            }
            if (pcVar11[lVar14 + 6] != '-') {
              if (pcVar11[lVar14 + 6] == 'r') {
                uVar7 = uVar7 | 4;
              }
              else {
                uVar7 = uVar7 | 0x1000000;
              }
            }
            if (pcVar11[lVar14 + 7] != '-') {
              if (pcVar11[lVar14 + 7] == 'w') {
                uVar7 = uVar7 | 2;
              }
              else {
                uVar7 = uVar7 | 0x1000000;
              }
            }
            cVar3 = pcVar11[lVar14 + 8];
            if (cVar3 != '-') {
              if (cVar3 == 'T') {
                uVar7 = uVar7 | 0x200;
              }
              else if (cVar3 == 't') {
                uVar7 = uVar7 | 0x201;
              }
              else {
                if (cVar3 != 'x') goto LAB_00125363;
                uVar7 = uVar7 | 1;
              }
            }
            if (uVar7 < 0x1000000) {
              lVar6 = *(long *)(piVar4 + 4);
              puVar1 = (uint *)(lVar6 + 0x60);
              *puVar1 = *puVar1 | 8;
              *(uint *)(lVar6 + 0x18) = uVar7;
              *(long *)(piVar4 + 0x12) = lVar14;
              goto LAB_001252c8;
            }
          }
          goto LAB_00125363;
        }
        break;
      case 3:
        iVar9 = piVar4[2];
        if (iVar9 == 1) {
          iVar9 = piVar4[6];
          piVar4[6] = iVar9 + 1U;
          if (bVar2 == 0x20) {
            pcVar10->b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
            lVar14 = strtol(pcVar10->b_data + *(long *)(piVar4 + 8),&p,10);
            if ((*p == '\0') && (lVar14 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
              lVar6 = *(long *)(piVar4 + 4);
              puVar1 = (uint *)(lVar6 + 0x60);
              *puVar1 = *puVar1 | 0x80;
              *(long *)(lVar6 + 0x30) = lVar14;
            }
            piVar4[6] = 0;
            piVar4[8] = 0;
            piVar4[9] = 0;
            piVar4[1] = 4;
            piVar4[2] = 0;
          }
          else if ((byte)(bVar2 - 0x3a) < 0xf6) goto LAB_00125363;
        }
        else {
LAB_00124c27:
          if ((iVar9 == 0) && (bVar2 != 0x20)) {
            if ((byte)(bVar2 - 0x30) < 10) goto LAB_00124c70;
            goto LAB_00125363;
          }
        }
        break;
      case 4:
        iVar9 = piVar4[2];
        if (iVar9 == 1) {
          iVar9 = piVar4[6];
          piVar4[6] = iVar9 + 1U;
          if (bVar2 == 0x20) {
            pcVar10->b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
            *(undefined8 *)(piVar4 + 0xc) = *(undefined8 *)(piVar4 + 8);
            piVar4[1] = 5;
            piVar4[2] = 0;
LAB_00124c10:
            piVar4[8] = 0;
            piVar4[9] = 0;
LAB_00124cb0:
            piVar4[6] = 0;
          }
        }
        else {
LAB_00124c5e:
          if (iVar9 == 0) goto switchD_00124a67_caseD_0;
        }
        break;
      case 5:
        iVar9 = piVar4[2];
        if (iVar9 != 1) goto LAB_00124c5e;
        iVar9 = piVar4[6];
        piVar4[6] = iVar9 + 1U;
        if (bVar2 == 0x20) {
          pcVar10->b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
          *(undefined8 *)(piVar4 + 0xe) = *(undefined8 *)(piVar4 + 8);
          piVar4[1] = 6;
          piVar4[2] = 0;
          goto LAB_00124c10;
        }
        break;
      case 6:
        iVar9 = piVar4[2];
        if (iVar9 != 1) goto LAB_00124c27;
        iVar9 = piVar4[6];
        piVar4[6] = iVar9 + 1U;
        if (bVar2 == 0x20) {
          pcVar10->b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
          lVar14 = strtol(pcVar10->b_data + *(long *)(piVar4 + 8),&p,10);
          if ((*p == '\0') && (lVar14 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
            lVar6 = *(long *)(piVar4 + 4);
            puVar1 = (uint *)(lVar6 + 0x60);
            *puVar1 = *puVar1 | 0x40;
            *(long *)(lVar6 + 0x28) = lVar14;
          }
          piVar4[6] = 0;
          piVar4[8] = 0;
          piVar4[9] = 0;
          piVar4[1] = 7;
          piVar4[2] = 0;
        }
        else {
          ppuVar15 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar15 + uVar19 * 2 + 1) & 8) == 0) goto LAB_00125363;
        }
        break;
      case 7:
        switch(piVar4[2]) {
        case 0:
          if (bVar2 != 0x20) {
            ppuVar15 = __ctype_b_loc();
            if (((*ppuVar15)[uVar19] & 8) == 0) goto LAB_00125363;
            goto LAB_00124c70;
          }
          break;
        case 1:
          piVar4[6] = piVar4[6] + 1;
          if (bVar2 == 0x20) {
LAB_00124f13:
            piVar4[2] = 2;
          }
          else {
LAB_00124f20:
            ppuVar15 = __ctype_b_loc();
            if ((((*ppuVar15)[uVar19] & 8) == 0) && (bVar2 != 0x2e)) goto LAB_00125363;
          }
          break;
        case 2:
          piVar4[6] = piVar4[6] + 1;
          if (bVar2 != 0x20) {
            ppuVar15 = __ctype_b_loc();
            if (((*ppuVar15)[uVar19] & 8) != 0) goto LAB_0012501d;
            goto LAB_00125363;
          }
          break;
        case 3:
          piVar4[6] = piVar4[6] + 1;
          if (bVar2 != 0x20) goto LAB_00124f20;
LAB_00125055:
          piVar4[2] = 4;
          break;
        case 4:
          piVar4[6] = piVar4[6] + 1;
          if (bVar2 != 0x20) {
            ppuVar15 = __ctype_b_loc();
            if (((*ppuVar15)[uVar19] & 8) == 0) goto LAB_00125363;
            piVar4[2] = 5;
          }
          break;
        case 5:
          iVar9 = piVar4[6];
          piVar4[6] = iVar9 + 1U;
          if (bVar2 == 0x20) {
            pcVar10->b_data[((ulong)(iVar9 + 1U) - 1) + *(long *)(piVar4 + 8)] = '\0';
            *(undefined8 *)(piVar4 + 0x10) = *(undefined8 *)(piVar4 + 8);
            if (pcVar10->filetype == CURLFILETYPE_SYMLINK) {
              piVar4[1] = 9;
              piVar4[2] = 0;
            }
            else {
              piVar4[1] = 8;
              piVar4[2] = 0;
            }
          }
          else {
            ppuVar15 = __ctype_b_loc();
            if (((((*ppuVar15)[uVar19] & 8) == 0) && (bVar2 != 0x2e)) && (bVar2 != 0x3a))
            goto LAB_00125363;
          }
        }
        break;
      case 8:
        iVar9 = piVar4[2];
        if (iVar9 == 2) {
          if (bVar2 != 10) goto LAB_00125363;
          pcVar10->b_data[(ulong)(uint)piVar4[6] + *(long *)(piVar4 + 8)] = '\0';
        }
        else {
          if (iVar9 != 1) goto LAB_00124c5e;
          iVar9 = piVar4[6];
          uVar7 = iVar9 + 1;
          piVar4[6] = uVar7;
          if (bVar2 != 10) {
            if (bVar2 == 0xd) {
              piVar4[6] = iVar9;
              goto LAB_00124f13;
            }
            break;
          }
          pcVar10->b_data[((ulong)uVar7 - 1) + *(long *)(piVar4 + 8)] = '\0';
        }
        *(undefined8 *)(piVar4 + 10) = *(undefined8 *)(piVar4 + 8);
        piVar4[1] = 1;
        err = ftp_pl_insert_finfo((connectdata *)connptr,pcVar10);
        if (err != CURLE_OK) goto LAB_0012536a;
        break;
      case 9:
        switch(piVar4[2]) {
        case 0:
switchD_00124a67_caseD_0:
          if (bVar2 != 0x20) {
LAB_00124c70:
            *(size_t *)(piVar4 + 8) = pcVar10->b_used - 1;
            piVar4[6] = 1;
            piVar4[2] = 1;
          }
          break;
        case 1:
          piVar4[6] = piVar4[6] + 1;
          if (bVar2 == 0x20) goto LAB_00124f13;
          if ((bVar2 == 10) || (bVar2 == 0xd)) goto LAB_00125363;
          break;
        case 2:
          piVar4[6] = piVar4[6] + 1;
          if (bVar2 != 0x2d) goto LAB_00125034;
LAB_0012501d:
          piVar4[2] = 3;
          break;
        case 3:
          piVar4[6] = piVar4[6] + 1;
          if (bVar2 == 0x3e) goto LAB_00125055;
LAB_00125034:
          if ((bVar2 != 10) && (bVar2 != 0xd)) goto LAB_00125048;
          goto LAB_00125363;
        case 4:
          iVar9 = piVar4[6];
          piVar4[6] = iVar9 + 1U;
          if (bVar2 != 0x20) goto LAB_00125034;
          piVar4[2] = 5;
          pcVar10->b_data[((ulong)(iVar9 + 1U) - 4) + *(long *)(piVar4 + 8)] = '\0';
          *(undefined8 *)(piVar4 + 10) = *(undefined8 *)(piVar4 + 8);
          piVar4[6] = 0;
          piVar4[8] = 0;
          piVar4[9] = 0;
          break;
        case 5:
          if ((bVar2 == 10) || (bVar2 == 0xd)) goto LAB_00125363;
          piVar4[2] = 6;
          *(size_t *)(piVar4 + 8) = pcVar10->b_used - 1;
          piVar4[6] = 1;
          break;
        case 6:
          iVar9 = piVar4[6];
          uVar7 = iVar9 + 1;
          piVar4[6] = uVar7;
          if (bVar2 == 10) {
            pcVar10->b_data[((ulong)uVar7 - 1) + *(long *)(piVar4 + 8)] = '\0';
LAB_001252f4:
            *(undefined8 *)(piVar4 + 0x14) = *(undefined8 *)(piVar4 + 8);
            err = ftp_pl_insert_finfo((connectdata *)connptr,pcVar10);
            if (err != CURLE_OK) goto LAB_0012536a;
            piVar4[1] = 1;
          }
          else if (bVar2 == 0xd) {
            piVar4[6] = iVar9;
            piVar4[2] = 7;
          }
          break;
        case 7:
          if (bVar2 == 10) {
            pcVar10->b_data[((ulong)(uint)piVar4[6] - 1) + *(long *)(piVar4 + 8)] = '\0';
            goto LAB_001252f4;
          }
LAB_00125363:
          err = CURLE_FTP_BAD_FILE_LIST;
LAB_0012536a:
          PL_ERROR((connectdata *)connptr,err);
          return uVar16;
        }
      }
switchD_00124852_default:
    }
  }
  return uVar16;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct connectdata *conn = (struct connectdata *)connptr;
  struct ftp_wc_tmpdata *tmpdata = conn->data->wildcard.tmp;
  struct ftp_parselist_data *parser = tmpdata->parser;
  struct curl_fileinfo *finfo;
  unsigned long i = 0;
  CURLcode rc;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is hadled later
     *    in wc_statemach()
     */
    return bufflen;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = (buffer[0] >= '0' && buffer[0] <= '9') ?
                       OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */

    char c = buffer[i];
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        return bufflen;
      }
      parser->file_data->b_data = malloc(FTP_BUFFER_ALLOCSIZE);
      if(!parser->file_data->b_data) {
        PL_ERROR(conn, CURLE_OUT_OF_MEMORY);
        return bufflen;
      }
      parser->file_data->b_size = FTP_BUFFER_ALLOCSIZE;
      parser->item_offset = 0;
      parser->item_length = 0;
    }

    finfo = parser->file_data;
    finfo->b_data[finfo->b_used++] = c;

    if(finfo->b_used >= finfo->b_size - 1) {
      /* if it is important, extend buffer space for file data */
      char *tmp = realloc(finfo->b_data,
                          finfo->b_size + FTP_BUFFER_ALLOCSIZE);
      if(tmp) {
        finfo->b_size += FTP_BUFFER_ALLOCSIZE;
        finfo->b_data = tmp;
      }
      else {
        Curl_fileinfo_dtor(NULL, parser->file_data);
        parser->file_data = NULL;
        parser->error = CURLE_OUT_OF_MEMORY;
        PL_ERROR(conn, CURLE_OUT_OF_MEMORY);
        return bufflen;
      }
    }

    switch (parser->os_type) {
    case OS_TYPE_UNIX:
      switch (parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            finfo->b_used = 0;
            i--;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            finfo->b_used--;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_length - 1] = 0;
            if(strncmp("total ", finfo->b_data, 6) == 0) {
              char *endptr = finfo->b_data+6;
              /* here we can deal with directory size */
              while(ISSPACE(*endptr))
                endptr++;
              if(*endptr != 0) {
                PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                return bufflen;
              }
              else {
                parser->state.UNIX.main = PL_UNIX_FILETYPE;
                finfo->b_used = 0;
              }
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch (c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
          return bufflen;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          finfo->b_data[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(finfo->b_data + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          parser->file_data->flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(finfo->b_data + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(c < '0' || c > '9') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(c >= '0' && c <= '9') {
              parser->item_offset = finfo->b_used - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            fsize = curlx_strtoofft(finfo->b_data+parser->item_offset, &p, 10);
            if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                               fsize != CURL_OFF_T_MIN) {
              parser->file_data->flags |= CURLFINFOFLAG_KNOWN_SIZE;
              parser->file_data->size = fsize;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_TIME;
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
          }
          else if(!ISDIGIT(c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = finfo->b_used -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            if(ftp_pl_gettime(parser, finfo->b_data + parser->item_offset)) {
              parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
            }
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            finfo->b_data[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length ++;
          if(c == '\r') {
            parser->item_length --;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
        }
        else {
          PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
          return bufflen;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISSPACE(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            finfo->b_data[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c == ' ') {

          }
          else {
            parser->item_offset = finfo->b_used - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            finfo->b_data[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", finfo->b_data + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              finfo->size = curlx_strtoofft(finfo->b_data +
                                            parser->item_offset,
                                            &endptr, 10);
              if(!*endptr) {
                if(finfo->size == CURL_OFF_T_MAX ||
                   finfo->size == CURL_OFF_T_MIN) {
                  if(errno == ERANGE) {
                    PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                    return bufflen;
                  }
                }
              }
              else {
                PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
                return bufflen;
              }
              /* correct file type */
              parser->file_data->filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch (parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = finfo->b_used -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            finfo->b_data[finfo->b_used - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            finfo->b_data[finfo->b_used - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            rc = ftp_pl_insert_finfo(conn, finfo);
            if(rc) {
              PL_ERROR(conn, rc);
              return bufflen;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            PL_ERROR(conn, CURLE_FTP_BAD_FILE_LIST);
            return bufflen;
          }
          break;
        }
        break;
      }
      break;
    default:
      return bufflen+1;
    }

    i++;
  }

  return bufflen;
}